

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O0

void __thiscall
spvtools::opt::(anonymous_namespace)::
FoldUnaryOp(std::function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>)
::$_0::~__0(__0 *this)

{
  anon_class_32_1_40d62dcf *this_local;
  
  std::
  function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
  ::~function((function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
               *)this);
  return;
}

Assistant:

ConstantFoldingRule FoldUnaryOp(UnaryScalarFoldingRule scalar_rule) {
  return [scalar_rule](IRContext* context, Instruction* inst,
                       const std::vector<const analysis::Constant*>& constants)
             -> const analysis::Constant* {
    analysis::ConstantManager* const_mgr = context->get_constant_mgr();
    analysis::TypeManager* type_mgr = context->get_type_mgr();
    const analysis::Type* result_type = type_mgr->GetType(inst->type_id());
    const analysis::Vector* vector_type = result_type->AsVector();

    const analysis::Constant* arg =
        (inst->opcode() == spv::Op::OpExtInst) ? constants[1] : constants[0];

    if (arg == nullptr) {
      return nullptr;
    }

    if (vector_type != nullptr) {
      std::vector<const analysis::Constant*> a_components;
      std::vector<const analysis::Constant*> results_components;

      a_components = arg->GetVectorComponents(const_mgr);

      // Fold each component of the vector.
      for (uint32_t i = 0; i < a_components.size(); ++i) {
        results_components.push_back(scalar_rule(vector_type->element_type(),
                                                 a_components[i], const_mgr));
        if (results_components[i] == nullptr) {
          return nullptr;
        }
      }

      // Build the constant object and return it.
      std::vector<uint32_t> ids;
      for (const analysis::Constant* member : results_components) {
        ids.push_back(const_mgr->GetDefiningInstruction(member)->result_id());
      }
      return const_mgr->GetConstant(vector_type, ids);
    } else {
      return scalar_rule(result_type, arg, const_mgr);
    }
  };
}